

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O1

char * reader_string(lua_State *L,void *ud,size_t *size)

{
  if (*(size_t *)((long)ud + 8) != 0) {
    *size = *(size_t *)((long)ud + 8);
    *(undefined8 *)((long)ud + 8) = 0;
    return *ud;
  }
  return (char *)0x0;
}

Assistant:

static const char *reader_string(lua_State *L, void *ud, size_t *size)
{
  StringReaderCtx *ctx = (StringReaderCtx *)ud;
  UNUSED(L);
  if (ctx->size == 0) return NULL;
  *size = ctx->size;
  ctx->size = 0;
  return ctx->str;
}